

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::do_resume(torrent *this)

{
  int *piVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  time_point32 tVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  _List_node_base *p_Var7;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> local_28;
  
  if (((this->super_torrent_hot_members).field_0x4b & 0x18) != 0) {
    bVar2 = want_tick(this);
    update_list(this,(torrent_list_index_t)0x1,bVar2);
    return;
  }
  p_Var7 = (_List_node_base *)&this->m_extensions;
  while (p_Var7 = (((_List_base<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
                     *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var7 != (_List_node_base *)&this->m_extensions) {
    cVar3 = (**(code **)(*(long *)p_Var7[1]._M_next + 0x38))();
    if (cVar3 != '\0') {
      return;
    }
  }
  iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [5])();
  if ((*(uint *)(CONCAT44(extraout_var,iVar4) + 0x68) & 0x40) != 0) {
    iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)&stack0xffffffffffffffd0);
    alert_manager::emplace_alert<libtorrent::torrent_resumed_alert,libtorrent::torrent_handle>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar4),
               (torrent_handle *)&stack0xffffffffffffffd0);
    if (local_28._M_head_impl != (piece_picker *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)&((local_28._M_head_impl)->m_piece_map).
                                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                .
                                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4);
        iVar4 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar4 = *(int *)((long)&((local_28._M_head_impl)->m_piece_map).
                                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                .
                                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4);
        *(int *)((long)&((local_28._M_head_impl)->m_piece_map).
                        super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        .
                        super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar4 + -1;
      }
      if (iVar4 == 1) {
        (*(code *)((local_28._M_head_impl)->m_piece_map).
                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  .
                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ._M_impl.super__Vector_impl_data._M_start[3])();
      }
    }
  }
  this->field_0x5e0 = this->field_0x5e0 | 1;
  this->field_0x5c0 = this->field_0x5c0 | 3;
  tVar5 = time_now32();
  (this->m_started).__d.__r = (rep_conflict)tVar5.__d.__r;
  bVar2 = is_seed(this);
  if (bVar2) {
    (this->m_became_seed).__d.__r = (rep_conflict)tVar5.__d.__r;
  }
  bVar2 = is_finished(this);
  if (bVar2) {
    (this->m_became_finished).__d.__r = (rep_conflict)tVar5.__d.__r;
  }
  clear_error(this);
  uVar6 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  if (((uVar6 & 0xe00000000000000) == 0x200000000000000) && ((this->field_0x600 & 1) != 0)) {
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x2c])
              ();
    uVar6 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  }
  if ((((uVar6 & 0xe00000008000000) == 0x200000000000000) && ((uVar6 & 0x14000000) == 0)) &&
     ((this->m_error).failed_ == false)) {
    start_checking(this);
  }
  state_updated(this);
  update_want_peers(this);
  bVar2 = want_tick(this);
  update_list(this,(torrent_list_index_t)0x1,bVar2);
  update_want_scrape(this);
  update_gauge(this);
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xe00000000000000) ==
      0x200000000000000) {
    return;
  }
  start_announcing(this);
  do_connect_boost(this);
  return;
}

Assistant:

void torrent::do_resume()
	{
		TORRENT_ASSERT(is_single_thread());
		if (is_paused())
		{
			update_want_tick();
			return;
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_extensions)
		{
			if (ext->on_resume()) return;
		}
#endif

		if (alerts().should_post<torrent_resumed_alert>())
			alerts().emplace_alert<torrent_resumed_alert>(get_handle());

		m_announce_to_dht = true;
		m_announce_to_trackers = true;
		m_announce_to_lsd = true;

		m_started = aux::time_now32();
		if (is_seed()) m_became_seed = m_started;
		if (is_finished()) m_became_finished = m_started;

		clear_error();

		if (m_state == torrent_status::checking_files
			&& m_auto_managed)
		{
			m_ses.trigger_auto_manage();
		}

		if (should_check_files()) start_checking();

		state_updated();
		update_want_peers();
		update_want_tick();
		update_want_scrape();
		update_gauge();

		if (m_state == torrent_status::checking_files) return;

		start_announcing();

		do_connect_boost();
	}